

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<8,_embree::TriangleMi<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<8,_embree::TriangleMi<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  TriangleMesh *pTVar8;
  BuildPrim *pBVar9;
  long lVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  size_t sVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  size_t i;
  ulong uVar21;
  long lVar22;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  vuint4 v0;
  vuint4 vgeomID;
  vuint4 v1;
  vuint4 v2;
  vuint4 vprimID;
  
  uVar2 = current->_begin;
  uVar3 = current->_end;
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  vgeomID.field_0.v[0] = 0x50;
  this_01 = pTVar7->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    v2.field_0.v[0] = (longlong)this_01;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  uVar21 = (ulong)(uVar3 - uVar2);
  uVar14 = vgeomID.field_0.v[0];
  pTVar7->bytesUsed = pTVar7->bytesUsed + vgeomID.field_0.v[0];
  sVar17 = pTVar7->cur;
  uVar18 = (ulong)(-(int)sVar17 & 0xf);
  uVar15 = sVar17 + vgeomID.field_0.v[0] + uVar18;
  pTVar7->cur = uVar15;
  if (pTVar7->end < uVar15) {
    pTVar7->cur = sVar17;
    uVar15 = pTVar7->allocBlockSize;
    if ((ulong)(vgeomID.field_0.v[0] * 4) < uVar15 || vgeomID.field_0.v[0] * 4 - uVar15 == 0) {
      v0.field_0.v[0] = uVar15;
      pauVar16 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&v0);
      pTVar7->ptr = (char *)pauVar16;
      sVar17 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar17;
      pTVar7->end = v0.field_0.v[0];
      pTVar7->cur = uVar14;
      if ((ulong)v0.field_0.v[0] < (ulong)uVar14) {
        pTVar7->cur = 0;
        v0.field_0.v[0] = pTVar7->allocBlockSize;
        pauVar16 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&v0);
        pTVar7->ptr = (char *)pauVar16;
        sVar17 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar17;
        pTVar7->end = v0.field_0.v[0];
        pTVar7->cur = uVar14;
        if ((ulong)v0.field_0.v[0] < (ulong)uVar14) {
          pTVar7->cur = 0;
          pauVar16 = (undefined1 (*) [16])0x0;
          goto LAB_00e08777;
        }
      }
      pTVar7->bytesWasted = sVar17;
    }
    else {
      pauVar16 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar18;
    pauVar16 = (undefined1 (*) [16])(pTVar7->ptr + (uVar15 - vgeomID.field_0._0_8_));
  }
LAB_00e08777:
  v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
  v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
  v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
  vgeomID.field_0 =
       (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
       vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
  pTVar8 = this->mesh;
  pBVar9 = this->morton;
  uVar3 = this->geomID_;
  aVar24.m128[2] = INFINITY;
  aVar24._0_8_ = 0x7f8000007f800000;
  aVar24.m128[3] = INFINITY;
  aVar23.m128[2] = -INFINITY;
  aVar23._0_8_ = 0xff800000ff800000;
  aVar23.m128[3] = -INFINITY;
  vprimID.field_0 = vgeomID.field_0;
  for (lVar19 = 0; uVar21 * 4 - lVar19 != 0; lVar19 = lVar19 + 4) {
    uVar20 = *(uint *)((long)&pBVar9[uVar2].field_0 + lVar19 * 2 + 4);
    lVar22 = (ulong)uVar20 * *(long *)&pTVar8->field_0x68;
    lVar10 = *(long *)&(pTVar8->super_Geometry).field_0x58;
    pcVar11 = (pTVar8->vertices0).super_RawBufferView.ptr_ofs;
    uVar4 = *(uint *)(lVar10 + lVar22);
    uVar5 = *(uint *)(lVar10 + 4 + lVar22);
    uVar15 = (pTVar8->vertices0).super_RawBufferView.stride;
    uVar6 = *(uint *)(lVar10 + 8 + lVar22);
    auVar12 = vminps_avx((undefined1  [16])aVar24,*(undefined1 (*) [16])(pcVar11 + uVar4 * uVar15));
    auVar13 = vminps_avx(*(undefined1 (*) [16])(pcVar11 + uVar5 * uVar15),
                         *(undefined1 (*) [16])(pcVar11 + uVar6 * uVar15));
    aVar24 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx((undefined1  [16])aVar23,*(undefined1 (*) [16])(pcVar11 + uVar4 * uVar15));
    auVar13 = vmaxps_avx(*(undefined1 (*) [16])(pcVar11 + uVar5 * uVar15),
                         *(undefined1 (*) [16])(pcVar11 + uVar6 * uVar15));
    aVar23 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar12,auVar13);
    *(uint *)((long)&vgeomID.field_0 + lVar19) = uVar3;
    *(uint *)((long)&vprimID.field_0 + lVar19) = uVar20;
    uVar20 = (uint)(uVar15 >> 2) & 0x3fffffff;
    *(uint *)((long)&v0.field_0 + lVar19) = uVar20 * uVar4;
    *(uint *)((long)&v1.field_0 + lVar19) = uVar5 * uVar20;
    *(uint *)((long)&v2.field_0 + lVar19) = uVar20 * uVar6;
  }
  for (; uVar21 < 4; uVar21 = uVar21 + 1) {
    vprimID.field_0.i[uVar21] = 0xffffffff;
    v0.field_0.i[uVar21] = 0;
    vgeomID.field_0.i[uVar21] = vgeomID.field_0.i[0];
    v1.field_0.i[uVar21] = 0;
    v2.field_0.i[uVar21] = 0;
  }
  auVar12 = vmovntps_avx((undefined1  [16])v0.field_0);
  *pauVar16 = auVar12;
  auVar12 = vmovntps_avx((undefined1  [16])v1.field_0);
  pauVar16[1] = auVar12;
  auVar12 = vmovntps_avx((undefined1  [16])v2.field_0);
  pauVar16[2] = auVar12;
  auVar12 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
  pauVar16[3] = auVar12;
  auVar12 = vmovntps_avx((undefined1  [16])vprimID.field_0);
  pauVar16[4] = auVar12;
  (__return_storage_ptr__->ref).ptr = (ulong)pauVar16 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar24;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar23;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4i* accel = (Triangle4i*) alloc.malloc1(sizeof(Triangle4i),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 v0 = zero, v1 = zero, v2 = zero;
        vuint4 vgeomID = -1, vprimID = -1;
        const TriangleMesh* __restrict__ const mesh = this->mesh;
        
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID[i] = geomID_;
          vprimID[i] = primID;
          unsigned int int_stride = mesh->vertices0.getStride()/4;
          v0[i] = tri.v[0] * int_stride; 
          v1[i] = tri.v[1] * int_stride;
          v2[i] = tri.v[2] * int_stride;
        }
        
        for (size_t i=items; i<4; i++)
        {
          vgeomID[i] = vgeomID[0];
          vprimID[i] = -1;
          v0[i] = 0;
          v1[i] = 0; 
          v2[i] = 0;
        }
        Triangle4i::store_nt(accel,Triangle4i(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }